

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *expected_expression,char *actual_expression,BiggestInt expected,
          BiggestInt actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar1;
  BiggestInt local_60;
  BiggestInt expected_local;
  BiggestInt actual_local;
  String local_40;
  
  if (expected == actual) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_60 = expected;
    expected_local = actual;
    FormatForComparisonFailureMessage<long_long,long_long>(&actual_local,&local_60);
    FormatForComparisonFailureMessage<long_long,long_long>((longlong *)&local_40,&expected_local);
    EqFailure(this,expected_expression,actual_expression,(String *)&actual_local,&local_40,false);
    String::~String(&local_40);
    String::~String((String *)&actual_local);
    actual_expression = (char *)extraout_RDX;
  }
  AVar1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_expression;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            BiggestInt expected,
                            BiggestInt actual) {
  if (expected == actual) {
    return AssertionSuccess();
  }

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}